

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void bhdct_delete(planck_unit_test_t *tc,ion_dictionary_t *dict,ion_key_t key,
                 ion_err_t expected_status,ion_result_count_t expected_count,
                 ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  undefined7 in_register_00000009;
  
  iVar2 = dictionary_delete(dict,key);
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,(int32_t)CONCAT71(in_register_00000009,expected_status),(int)iVar2.error,
                     0xdc,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                    );
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_int_are_equal
                      (tc,expected_count,iVar2.count,0xdd,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/behaviour/dictionary/behaviour_dictionary.c"
                      );
    if (pVar1 != '\0') {
      if (check_result != '\0') {
        bhdct_get(tc,dict,key,(ion_value_t)0x0,'\x01',0);
        return;
      }
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
bhdct_delete(
	planck_unit_test_t	*tc,
	ion_dictionary_t	*dict,
	ion_key_t			key,
	ion_err_t			expected_status,
	ion_result_count_t	expected_count,
	ion_boolean_t		check_result
) {
	ion_status_t status = dictionary_delete(dict, key);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		bhdct_get(tc, dict, key, NULL, err_item_not_found, 0);
	}
}